

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderBasicData.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::Mode5TransponderBasicData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Mode5TransponderBasicData *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Mode5TransponderBasicData *local_18;
  Mode5TransponderBasicData *this_local;
  
  local_18 = this;
  this_local = (Mode5TransponderBasicData *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Mode 5 Transponder Basic Data:");
  Mode5TransponderStatus::GetAsString_abi_cxx11_(&local_1f0,&this->m_Status);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"Personal ID Number: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16PIN);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Message Formats:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32MsgFormats);
  poVar1 = std::operator<<(poVar1,"\n");
  EnhancedMode1Code::GetAsString_abi_cxx11_(&local_230,&this->m_EM1Code);
  UTILS::IndentString(&local_210,&local_230,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"National Origin:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16NationalOrigin);
  poVar1 = std::operator<<(poVar1,"\n");
  Mode5TransponderSupplementalData::GetAsString_abi_cxx11_(&local_250,&this->m_SupplementalData);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  ENUMS::GetEnumAsStringNavigationSource_abi_cxx11_
            (&local_270,(ENUMS *)(ulong)this->m_ui8NavSrc,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Figure Of Merit:    ");
  poVar1 = std::operator<<(poVar1,this->m_ui8FigMerit);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Mode5TransponderBasicData::GetAsString() const
{
    KStringStream ss;

    ss << "Mode 5 Transponder Basic Data:"
        << IndentString( m_Status.GetAsString() )
        << "Personal ID Number: " << m_ui16PIN            << "\n"
        << "Message Formats:    " << m_ui32MsgFormats     << "\n"
        << IndentString( m_EM1Code.GetAsString() )
        << "National Origin:    " << m_ui16NationalOrigin << "\n"
        << m_SupplementalData.GetAsString()
        << GetEnumAsStringNavigationSource( m_ui8NavSrc ) << "\n"
        << "Figure Of Merit:    " << m_ui8FigMerit        << "\n";

    return ss.str();
}